

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum_to_spectrum.cc
# Opt level: O0

void anon_unknown.dwarf_fb7e::SelectOperation
               (InputOutputFormats input_format,InputOutputFormats output_format,
               vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
               *operations)

{
  vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
  *this;
  value_type *in_RDX;
  undefined4 in_ESI;
  undefined4 in_EDI;
  value_type *in_stack_fffffffffffffe98;
  vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
  *in_stack_fffffffffffffea0;
  
  switch(in_EDI) {
  case 0:
    switch(in_ESI) {
    case 0:
      break;
    case 1:
      operator_new(8);
      LogAmplitudeSpectrumInDecibelsToLogAmplitudeSpectrum::
      LogAmplitudeSpectrumInDecibelsToLogAmplitudeSpectrum
                ((LogAmplitudeSpectrumInDecibelsToLogAmplitudeSpectrum *)in_stack_fffffffffffffea0);
      std::
      vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
      ::push_back(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      break;
    case 2:
      operator_new(8);
      LogAmplitudeSpectrumInDecibelsToAmplitudeSpectrum::
      LogAmplitudeSpectrumInDecibelsToAmplitudeSpectrum
                ((LogAmplitudeSpectrumInDecibelsToAmplitudeSpectrum *)in_stack_fffffffffffffea0);
      std::
      vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
      ::push_back(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      break;
    case 3:
      operator_new(8);
      LogAmplitudeSpectrumInDecibelsToPowerSpectrum::LogAmplitudeSpectrumInDecibelsToPowerSpectrum
                ((LogAmplitudeSpectrumInDecibelsToPowerSpectrum *)in_stack_fffffffffffffea0);
      std::
      vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
      ::push_back(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    }
    break;
  case 1:
    switch(in_ESI) {
    case 0:
      operator_new(8);
      LogAmplitudeSpectrumToLogAmplitudeSpectrumInDecibels::
      LogAmplitudeSpectrumToLogAmplitudeSpectrumInDecibels
                ((LogAmplitudeSpectrumToLogAmplitudeSpectrumInDecibels *)in_stack_fffffffffffffea0);
      std::
      vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
      ::push_back(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      break;
    case 1:
      break;
    case 2:
      operator_new(8);
      LogAmplitudeSpectrumToAmplitudeSpectrum::LogAmplitudeSpectrumToAmplitudeSpectrum
                ((LogAmplitudeSpectrumToAmplitudeSpectrum *)in_stack_fffffffffffffea0);
      std::
      vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
      ::push_back(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      break;
    case 3:
      operator_new(8);
      LogAmplitudeSpectrumToPowerSpectrum::LogAmplitudeSpectrumToPowerSpectrum
                ((LogAmplitudeSpectrumToPowerSpectrum *)in_stack_fffffffffffffea0);
      std::
      vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
      ::push_back(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    }
    break;
  case 2:
    switch(in_ESI) {
    case 0:
      operator_new(8);
      AmplitudeSpectrumToLogAmplitudeSpectrumInDecibels::
      AmplitudeSpectrumToLogAmplitudeSpectrumInDecibels
                ((AmplitudeSpectrumToLogAmplitudeSpectrumInDecibels *)in_stack_fffffffffffffea0);
      std::
      vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
      ::push_back(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      break;
    case 1:
      operator_new(8);
      AmplitudeSpectrumToLogAmplitudeSpectrum::AmplitudeSpectrumToLogAmplitudeSpectrum
                ((AmplitudeSpectrumToLogAmplitudeSpectrum *)in_stack_fffffffffffffea0);
      std::
      vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
      ::push_back(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      break;
    case 2:
      break;
    case 3:
      operator_new(8);
      AmplitudeSpectrumToPowerSpectrum::AmplitudeSpectrumToPowerSpectrum
                ((AmplitudeSpectrumToPowerSpectrum *)in_stack_fffffffffffffea0);
      std::
      vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
      ::push_back(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    }
    break;
  case 3:
    switch(in_ESI) {
    case 0:
      operator_new(8);
      PowerSpectrumToLogAmplitudeSpectrumInDecibels::PowerSpectrumToLogAmplitudeSpectrumInDecibels
                ((PowerSpectrumToLogAmplitudeSpectrumInDecibels *)in_stack_fffffffffffffea0);
      std::
      vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
      ::push_back(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      break;
    case 1:
      operator_new(8);
      PowerSpectrumToLogAmplitudeSpectrum::PowerSpectrumToLogAmplitudeSpectrum
                ((PowerSpectrumToLogAmplitudeSpectrum *)in_stack_fffffffffffffea0);
      std::
      vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
      ::push_back(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      break;
    case 2:
      this = (vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
              *)operator_new(8);
      PowerSpectrumToAmplitudeSpectrum::PowerSpectrumToAmplitudeSpectrum
                ((PowerSpectrumToAmplitudeSpectrum *)this);
      std::
      vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
      ::push_back(this,in_RDX);
      break;
    case 3:
    }
  }
  return;
}

Assistant:

void SelectOperation(
    sptk::SpectrumToSpectrum::InputOutputFormats input_format,
    sptk::SpectrumToSpectrum::InputOutputFormats output_format,
    std::vector<sptk::SpectrumToSpectrum::OperationInterface*>* operations) {
  switch (input_format) {
    case sptk::SpectrumToSpectrum::kLogAmplitudeSpectrumInDecibels: {
      switch (output_format) {
        case sptk::SpectrumToSpectrum::kLogAmplitudeSpectrumInDecibels: {
          // nothing to do
          break;
        }
        case sptk::SpectrumToSpectrum::kLogAmplitudeSpectrum: {
          operations->push_back(
              new LogAmplitudeSpectrumInDecibelsToLogAmplitudeSpectrum());
          break;
        }
        case sptk::SpectrumToSpectrum::kAmplitudeSpectrum: {
          operations->push_back(
              new LogAmplitudeSpectrumInDecibelsToAmplitudeSpectrum());
          break;
        }
        case sptk::SpectrumToSpectrum::kPowerSpectrum: {
          operations->push_back(
              new LogAmplitudeSpectrumInDecibelsToPowerSpectrum());
          break;
        }
        default: {
          return;
        }
      }
      break;
    }
    case sptk::SpectrumToSpectrum::kLogAmplitudeSpectrum: {
      switch (output_format) {
        case sptk::SpectrumToSpectrum::kLogAmplitudeSpectrumInDecibels: {
          operations->push_back(
              new LogAmplitudeSpectrumToLogAmplitudeSpectrumInDecibels());
          break;
        }
        case sptk::SpectrumToSpectrum::kLogAmplitudeSpectrum: {
          // nothing to do
          break;
        }
        case sptk::SpectrumToSpectrum::kAmplitudeSpectrum: {
          operations->push_back(new LogAmplitudeSpectrumToAmplitudeSpectrum());
          break;
        }
        case sptk::SpectrumToSpectrum::kPowerSpectrum: {
          operations->push_back(new LogAmplitudeSpectrumToPowerSpectrum());
          break;
        }
        default: {
          return;
        }
      }
      break;
    }
    case sptk::SpectrumToSpectrum::kAmplitudeSpectrum: {
      switch (output_format) {
        case sptk::SpectrumToSpectrum::kLogAmplitudeSpectrumInDecibels: {
          operations->push_back(
              new AmplitudeSpectrumToLogAmplitudeSpectrumInDecibels());
          break;
        }
        case sptk::SpectrumToSpectrum::kLogAmplitudeSpectrum: {
          operations->push_back(new AmplitudeSpectrumToLogAmplitudeSpectrum());
          break;
        }
        case sptk::SpectrumToSpectrum::kAmplitudeSpectrum: {
          // nothing to do
          break;
        }
        case sptk::SpectrumToSpectrum::kPowerSpectrum: {
          operations->push_back(new AmplitudeSpectrumToPowerSpectrum());
          break;
        }
        default: {
          return;
        }
      }
      break;
    }
    case sptk::SpectrumToSpectrum::kPowerSpectrum: {
      switch (output_format) {
        case sptk::SpectrumToSpectrum::kLogAmplitudeSpectrumInDecibels: {
          operations->push_back(
              new PowerSpectrumToLogAmplitudeSpectrumInDecibels());
          break;
        }
        case sptk::SpectrumToSpectrum::kLogAmplitudeSpectrum: {
          operations->push_back(new PowerSpectrumToLogAmplitudeSpectrum());
          break;
        }
        case sptk::SpectrumToSpectrum::kAmplitudeSpectrum: {
          operations->push_back(new PowerSpectrumToAmplitudeSpectrum());
          break;
        }
        case sptk::SpectrumToSpectrum::kPowerSpectrum: {
          // nothing to do
          break;
        }
        default: {
          return;
        }
      }
      break;
    }
    default: {
      return;
    }
  }
}